

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

Term * Kernel::Term::create(uint function,uint arity,TermList *args)

{
  int *piVar1;
  uint *puVar2;
  ulong uVar3;
  Cell *pCVar4;
  uint64_t *puVar5;
  TermSharing *pTVar6;
  uint uVar7;
  Term *pTVar8;
  ulong uVar9;
  size_t i;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  Cell *pCVar14;
  TermList *pTVar15;
  undefined4 in_register_0000003c;
  bool bVar16;
  bool bVar17;
  uint local_44;
  Cell *local_40;
  uint64_t local_38;
  
  pTVar6 = DAT_00b521b8;
  uVar9 = (ulong)arity;
  if (arity != 0) {
    bVar16 = false;
    uVar11 = 1;
    do {
      uVar3 = args[uVar11 - 1]._content;
      if ((uVar3 & 1) == 0) {
        if ((*(byte *)(uVar3 + 0x28) & 8) == 0) {
LAB_005bf9a3:
          if (!bVar16) {
            pTVar8 = (Term *)operator_new(CONCAT44(in_register_0000003c,function),arity,0);
            pTVar8->_vptr_Term = (_func_int **)&PTR_computable_00b3d668;
            pTVar8->_weight = 0;
            pTVar8->_kboWeight = -1;
            pTVar8->_maxRedLen = 0;
            (pTVar8->field_9)._vars = 0;
            pTVar8->_args[0]._content = 0xfffffc02;
            pTVar8->_functor = function;
            *(uint *)&pTVar8->field_0xc = arity & 0xfffffff;
            pTVar8->_args[arity & 0xfffffff]._content = args->_content;
            if (arity == 1) {
              return pTVar8;
            }
            uVar9 = 2;
            if (2 < arity) {
              uVar9 = (ulong)arity;
            }
            uVar11 = 1;
            iVar13 = -1;
            do {
              pTVar15 = args + uVar11;
              uVar11 = uVar11 + 1;
              pTVar8->_args[(int)((*(uint *)&pTVar8->field_0xc & 0xfffffff) + iVar13)]._content =
                   pTVar15->_content;
              iVar13 = iVar13 + -1;
            } while (uVar9 != uVar11);
            return pTVar8;
          }
          break;
        }
      }
      else if ((~(uint)uVar3 & 3) == 0) goto LAB_005bf9a3;
      bVar16 = uVar9 <= uVar11;
      bVar17 = uVar11 != uVar9;
      uVar11 = uVar11 + 1;
    } while (bVar17);
  }
  local_44 = function;
  uVar7 = 0x811c9dc5;
  lVar10 = 0;
  do {
    uVar7 = (*(byte *)((long)&local_44 + lVar10) ^ uVar7) * 0x1000193;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  if (arity != 0) {
    uVar11 = 0;
    do {
      local_38 = args[uVar11]._content;
      uVar12 = 0x811c9dc5;
      lVar10 = 0;
      do {
        uVar12 = (*(byte *)((long)&local_38 + lVar10) ^ uVar12) * 0x1000193;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      uVar11 = uVar11 + 1;
      uVar7 = (uVar12 ^ uVar7) * 0x1000193;
    } while (uVar11 != uVar9);
  }
  uVar11 = 2;
  if (2 < uVar7) {
    uVar11 = (ulong)uVar7;
  }
  if ((DAT_00b521b8->_terms)._maxEntries <= (DAT_00b521b8->_terms)._nonemptyCells) {
    Lib::Set<Kernel::Term_*,_Indexing::TermSharing>::expand(&DAT_00b521b8->_terms);
  }
  pCVar4 = (pTVar6->_terms)._entries;
  local_40 = (Cell *)0x0;
  pCVar14 = pCVar4 + uVar11 % (ulong)(uint)(pTVar6->_terms)._capacity;
  do {
    uVar7 = pCVar14->code;
    if (uVar7 == 0) {
      if (local_40 == (Cell *)0x0) {
        piVar1 = &(pTVar6->_terms)._nonemptyCells;
        *piVar1 = *piVar1 + 1;
        local_40 = pCVar14;
      }
      puVar2 = &(pTVar6->_terms)._size;
      *puVar2 = *puVar2 + 1;
      pTVar8 = (Term *)operator_new((ulong)uVar7,arity,0);
      pTVar8->_vptr_Term = (_func_int **)&PTR_computable_00b3d668;
      pTVar8->_weight = 0;
      pTVar8->_kboWeight = -1;
      pTVar8->_maxRedLen = 0;
      (pTVar8->field_9)._vars = 0;
      pTVar8->_args[0]._content = 0xfffffc02;
      pTVar8->_functor = function;
      *(uint *)&pTVar8->field_0xc = arity & 0xfffffff;
      if ((arity != 0) && (pTVar8->_args[arity & 0xfffffff]._content = args->_content, arity != 1))
      {
        pTVar15 = args + 1;
        lVar10 = -1;
        do {
          pTVar8->_args[(int)((*(uint *)&pTVar8->field_0xc & 0xfffffff) + (int)lVar10)]._content =
               pTVar15->_content;
          pTVar15 = pTVar15 + 1;
          lVar10 = lVar10 + -1;
        } while (-lVar10 != uVar9);
      }
      local_40->value = pTVar8;
      local_40->code = (uint)uVar11;
      Indexing::TermSharing::computeAndSetSharedTermData(DAT_00b521b8,pTVar8);
      return pTVar8;
    }
    if (uVar7 == 1) {
      if (local_40 == (Cell *)0x0) {
        local_40 = pCVar14;
      }
    }
    else if ((uVar7 == (uint)uVar11) && (pTVar8 = pCVar14->value, pTVar8->_functor == function)) {
      lVar10 = 0;
      pTVar15 = args;
      do {
        if (-lVar10 == uVar9) {
          return pTVar8;
        }
        iVar13 = (int)lVar10;
        puVar5 = &pTVar15->_content;
        lVar10 = lVar10 + -1;
        pTVar15 = pTVar15 + 1;
      } while (*puVar5 ==
               pTVar8->_args[(int)((*(uint *)&pTVar8->field_0xc & 0xfffffff) + iVar13)]._content);
    }
    pCVar14 = pCVar14 + 1;
    if (pCVar14 == (pTVar6->_terms)._afterLast) {
      pCVar14 = pCVar4;
    }
  } while( true );
}

Assistant:

Term* Term::create(unsigned function, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->functionArity(function), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    Term* s = new(arity) Term;
    s->makeSymbol(function,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_terms.rawFindOrInsert(allocTerm,
        Term::termHash(function, [&](auto i){ return args[i]; }, arity),
        [&](Term* t) { return t->functor() == function && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created);
    if (created) {
      env.sharing->computeAndSetSharedTermData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}